

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O0

LongNameHandler *
icu_63::number::impl::LongNameHandler::forMeasureUnit
          (Locale *loc,MeasureUnit *unitRef,MeasureUnit *perUnit,UNumberUnitWidth *width,
          PluralRules *rules,MicroPropsGenerator *parent,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  char *__s1;
  LongNameHandler *this;
  char *unit_00;
  bool bVar3;
  UnicodeString *local_318;
  UnicodeString *local_2d0;
  LongNameHandler *local_2c0;
  UnicodeString local_2a8 [8];
  undefined1 auStack_a8 [32];
  LongNameHandler *result;
  undefined1 local_80 [8];
  MeasureUnit resolved;
  bool isResolved;
  undefined1 local_58 [8];
  MeasureUnit unit;
  MicroPropsGenerator *parent_local;
  PluralRules *rules_local;
  UNumberUnitWidth *width_local;
  MeasureUnit *perUnit_local;
  MeasureUnit *unitRef_local;
  Locale *loc_local;
  
  unit._16_8_ = parent;
  MeasureUnit::MeasureUnit((MeasureUnit *)local_58,unitRef);
  __s1 = MeasureUnit::getType(perUnit);
  unit_00 = "none";
  iVar2 = strcmp(__s1,"none");
  if (iVar2 != 0) {
    resolved.fCurrency[3] = '\0';
    MeasureUnit::resolveUnitPerUnit
              ((MeasureUnit *)local_80,(MeasureUnit *)local_58,perUnit,
               (bool *)(resolved.fCurrency + 3));
    bVar3 = (resolved.fCurrency[3] & 1U) == 0;
    if (bVar3) {
      unit_00 = local_58;
      loc_local = (Locale *)
                  forCompoundUnit(loc,(MeasureUnit *)unit_00,perUnit,width,rules,
                                  (MicroPropsGenerator *)unit._16_8_,status);
    }
    else {
      unit_00 = local_80;
      MeasureUnit::operator=((MeasureUnit *)local_58,(MeasureUnit *)unit_00);
    }
    result._4_4_ = (uint)bVar3;
    MeasureUnit::~MeasureUnit((MeasureUnit *)local_80);
    if (result._4_4_ != 0) goto LAB_002e3651;
  }
  this = (LongNameHandler *)UMemory::operator_new((UMemory *)0x2c0,(size_t)unit_00);
  auStack_a8[0xf] = 0;
  local_2c0 = (LongNameHandler *)0x0;
  if (this != (LongNameHandler *)0x0) {
    auStack_a8[0xf] = 1;
    auStack_a8._16_8_ = this;
    LongNameHandler(this,rules,(MicroPropsGenerator *)unit._16_8_);
    local_2c0 = this;
  }
  auStack_a8._24_8_ = local_2c0;
  if (local_2c0 == (LongNameHandler *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    loc_local = (Locale *)0x0;
    result._4_4_ = 1;
  }
  else {
    local_2d0 = local_2a8;
    do {
      UnicodeString::UnicodeString(local_2d0);
      local_2d0 = local_2d0 + 1;
    } while (local_2d0 != (UnicodeString *)auStack_a8);
    anon_unknown.dwarf_137d20::getMeasureData(loc,(MeasureUnit *)local_58,width,local_2a8,status);
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      simpleFormatsToModifiers
                ((LongNameHandler *)auStack_a8._24_8_,local_2a8,UNUM_FIELD_COUNT,status);
    }
    loc_local = (Locale *)auStack_a8._24_8_;
    result._4_4_ = 1;
    local_318 = (UnicodeString *)auStack_a8;
    do {
      local_318 = local_318 + -1;
      UnicodeString::~UnicodeString(local_318);
    } while (local_318 != local_2a8);
  }
LAB_002e3651:
  MeasureUnit::~MeasureUnit((MeasureUnit *)local_58);
  return (LongNameHandler *)loc_local;
}

Assistant:

LongNameHandler*
LongNameHandler::forMeasureUnit(const Locale &loc, const MeasureUnit &unitRef, const MeasureUnit &perUnit,
                                const UNumberUnitWidth &width, const PluralRules *rules,
                                const MicroPropsGenerator *parent, UErrorCode &status) {
    MeasureUnit unit = unitRef;
    if (uprv_strcmp(perUnit.getType(), "none") != 0) {
        // Compound unit: first try to simplify (e.g., meters per second is its own unit).
        bool isResolved = false;
        MeasureUnit resolved = MeasureUnit::resolveUnitPerUnit(unit, perUnit, &isResolved);
        if (isResolved) {
            unit = resolved;
        } else {
            // No simplified form is available.
            return forCompoundUnit(loc, unit, perUnit, width, rules, parent, status);
        }
    }

    auto* result = new LongNameHandler(rules, parent);
    if (result == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return nullptr;
    }
    UnicodeString simpleFormats[ARRAY_LENGTH];
    getMeasureData(loc, unit, width, simpleFormats, status);
    if (U_FAILURE(status)) { return result; }
    // TODO: What field to use for units?
    result->simpleFormatsToModifiers(simpleFormats, UNUM_FIELD_COUNT, status);
    return result;
}